

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lcode.c
# Opt level: O0

int luaK_code(FuncState *fs,Instruction i)

{
  int iVar1;
  Proto *pPVar2;
  Instruction *pIVar3;
  int *piVar4;
  Proto *f;
  Instruction i_local;
  FuncState *fs_local;
  
  pPVar2 = fs->f;
  dischargejpc(fs);
  if (pPVar2->sp->sizecode < fs->pc + 1) {
    pIVar3 = (Instruction *)
             luaM_growaux_(fs->ls->L,pPVar2->sp->code,&pPVar2->sp->sizecode,4,0x7fffffff,"opcodes");
    pPVar2->sp->code = pIVar3;
  }
  pPVar2->sp->code[fs->pc] = i;
  if (pPVar2->sp->sizelineinfo < fs->pc + 1) {
    piVar4 = (int *)luaM_growaux_(fs->ls->L,pPVar2->sp->lineinfo,&pPVar2->sp->sizelineinfo,4,
                                  0x7fffffff,"opcodes");
    pPVar2->sp->lineinfo = piVar4;
  }
  pPVar2->sp->lineinfo[fs->pc] = fs->ls->lastline;
  iVar1 = fs->pc;
  fs->pc = iVar1 + 1;
  return iVar1;
}

Assistant:

static int luaK_code (FuncState *fs, Instruction i) {
  Proto *f = fs->f;
  dischargejpc(fs);  /* 'pc' will change */
  /* put new instruction in code array */
  luaM_growvector(fs->ls->L, f->sp->code, fs->pc, f->sp->sizecode, Instruction,
                  MAX_INT, "opcodes");
  f->sp->code[fs->pc] = i;
  /* save corresponding line information */
  luaM_growvector(fs->ls->L, f->sp->lineinfo, fs->pc, f->sp->sizelineinfo, int,
                  MAX_INT, "opcodes");
  f->sp->lineinfo[fs->pc] = fs->ls->lastline;
  return fs->pc++;
}